

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_readdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue this_obj;
  int iVar1;
  char *__name;
  int iVar2;
  DIR *__dirp;
  int *piVar3;
  dirent *pdVar4;
  char *in_RDI;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  int in_stack_00000010;
  uint32_t len;
  int err;
  JSValue obj;
  dirent *d;
  DIR *f;
  char *path;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  JSContext *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  JSValueUnion JVar8;
  int in_stack_ffffffffffffff98;
  undefined1 local_10 [16];
  
  JVar5.u._4_4_ = in_stack_ffffffffffffff5c;
  JVar5.u.int32 = in_stack_ffffffffffffff58;
  JVar5.tag = (int64_t)in_stack_ffffffffffffff60;
  __name = JS_ToCString((JSContext *)0x115af1,JVar5);
  if (__name == (char *)0x0) {
    local_10._0_8_ = local_10._4_8_ << 0x20;
    local_10._8_8_ = 6;
  }
  else {
    JVar5 = JS_NewArray(in_stack_ffffffffffffff60);
    JVar8 = JVar5.u;
    iVar1 = JS_IsException(JVar5);
    if (iVar1 == 0) {
      __dirp = opendir(__name);
      if (__dirp == (DIR *)0x0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
      }
      else {
        iVar1 = 0;
      }
      JS_FreeCString((JSContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
      if (__dirp != (DIR *)0x0) {
        in_stack_ffffffffffffff98 = 0;
        while( true ) {
          piVar3 = __errno_location();
          *piVar3 = 0;
          pdVar4 = readdir(__dirp);
          if (pdVar4 == (dirent *)0x0) break;
          iVar2 = in_stack_ffffffffffffff98 + 1;
          JVar6 = JS_NewString((JSContext *)
                               CONCAT44(in_stack_ffffffffffffff98,in_stack_ffffffffffffff70),in_RDI)
          ;
          this_obj.u._4_4_ = iVar1;
          this_obj.u.int32 = iVar2;
          this_obj.tag = (int64_t)JVar8.ptr;
          JS_DefinePropertyValueUint32
                    ((JSContext *)JVar6.tag,this_obj,JVar6.u._4_4_,JVar5,in_stack_00000010);
          in_stack_ffffffffffffff98 = iVar2;
        }
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        closedir(__dirp);
      }
      JVar6.u._4_4_ = iVar1;
      JVar6.u.int32 = in_stack_ffffffffffffff98;
      JVar6.tag = (int64_t)JVar8.ptr;
      local_10 = (undefined1  [16])make_obj_error((JSContext *)JVar5.tag,JVar6,JVar5.u._4_4_);
    }
    else {
      JS_FreeCString((JSContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
      local_10._0_8_ = local_10._4_8_ << 0x20;
      local_10._8_8_ = 6;
    }
  }
  JVar7.u = (JSValueUnion)local_10._0_8_;
  JVar7.tag = local_10._8_8_;
  return JVar7;
}

Assistant:

static JSValue js_os_readdir(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *path;
    DIR *f;
    struct dirent *d;
    JSValue obj;
    int err;
    uint32_t len;
    
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    obj = JS_NewArray(ctx);
    if (JS_IsException(obj)) {
        JS_FreeCString(ctx, path);
        return JS_EXCEPTION;
    }
    f = opendir(path);
    if (!f)
        err = errno;
    else
        err = 0;
    JS_FreeCString(ctx, path);
    if (!f)
        goto done;
    len = 0;
    for(;;) {
        errno = 0;
        d = readdir(f);
        if (!d) {
            err = errno;
            break;
        }
        JS_DefinePropertyValueUint32(ctx, obj, len++,
                                     JS_NewString(ctx, d->d_name),
                                     JS_PROP_C_W_E);
    }
    closedir(f);
 done:
    return make_obj_error(ctx, obj, err);
}